

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
subpage_write(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint64_t value,uint len,
             MemTxAttrs attrs)

{
  MemTxResult MVar1;
  uint64_t in_RAX;
  uint8_t buf [8];
  undefined8 local_8;
  
  local_8 = in_RAX;
  switch(len) {
  case 1:
    local_8 = CONCAT71((int7)(in_RAX >> 8),(char)value);
    break;
  case 2:
    local_8 = CONCAT62((int6)(in_RAX >> 0x10),(short)value);
    break;
  case 4:
    local_8 = CONCAT44((int)(in_RAX >> 0x20),(int)value);
    break;
  case 8:
    local_8 = value;
  }
  MVar1 = flatview_write(uc,*(FlatView **)((long)opaque + 0xa0),
                         addr + *(long *)((long)opaque + 0xa8),attrs,&local_8,(ulong)len);
  return MVar1;
}

Assistant:

static MemTxResult subpage_write(struct uc_struct *uc, void *opaque, hwaddr addr,
                                 uint64_t value, unsigned len, MemTxAttrs attrs)
{
    subpage_t *subpage = opaque;
    uint8_t buf[8];

#if defined(DEBUG_SUBPAGE)
    printf("%s: subpage %p len %u addr " TARGET_FMT_plx
           " value %"PRIx64"\n",
           __func__, subpage, len, addr, value);
#endif
    stn_p(buf, len, value);
    return flatview_write(uc, subpage->fv, addr + subpage->base, attrs, buf, len);
}